

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_remove.c
# Opt level: O0

void * linkedlist_remove(s_linkedlist *linked_list,uint index)

{
  void *pvVar1;
  void *element_to_return;
  s_linkedlist_node *node;
  uint index_local;
  s_linkedlist *linked_list_local;
  
  element_to_return = linked_list->head;
  node._4_4_ = index;
  while( true ) {
    if (element_to_return == (void *)0x0) {
      return (void *)0x0;
    }
    if (node._4_4_ == 0) break;
    node._4_4_ = node._4_4_ - 1;
    element_to_return = *(void **)((long)element_to_return + 8);
  }
  if (*element_to_return == 0) {
    linked_list->head = *(s_linkedlist_node **)((long)element_to_return + 8);
  }
  else {
    *(undefined8 *)(*element_to_return + 8) = *(undefined8 *)((long)element_to_return + 8);
  }
  if (*(long *)((long)element_to_return + 8) == 0) {
    linked_list->tail = *element_to_return;
  }
  else {
    **(undefined8 **)((long)element_to_return + 8) = *element_to_return;
  }
  pvVar1 = *(void **)((long)element_to_return + 0x10);
  free(element_to_return);
  linked_list->size = linked_list->size - 1;
  return pvVar1;
}

Assistant:

void *linkedlist_remove(s_linkedlist *linked_list, unsigned int index) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (index == 0) {
            if (node->previous == NULL) {
                linked_list->head = node->next;
            } else {
                node->previous->next = node->next;
            }

            if (node->next == NULL) {
                linked_list->tail = node->previous;
            } else {
                node->next->previous = node->previous;
            }

            void *element_to_return = node->element;

            free(node);
            linked_list->size -= 1;

            return (element_to_return);
        }

        index -= 1;
        node = node->next;
    }

    return (NULL);
}